

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O3

void uv::TCPClient::AfterClientClose(uv_handle_t *handle)

{
  char *__s;
  void *pvVar1;
  long lVar2;
  int errcode;
  uint uVar3;
  ILog4zManager *pIVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  long *in_FS_OFFSET;
  string local_48;
  
  pvVar1 = handle->data;
  fprintf(_stdout,"Close CB handle %p\n",handle);
  if (*(uv_handle_t **)((long)pvVar1 + 8) != handle) {
    return;
  }
  if (*(char *)((long)pvVar1 + 0x588) != '\x01') {
    return;
  }
  errcode = uv_timer_start((long)pvVar1 + 0x4f0,ReconnectTimer,*(undefined8 *)((long)pvVar1 + 0x590)
                          );
  if (errcode == 0) {
    return;
  }
  uv_close((long)pvVar1 + 0x4f0,AfterClientClose);
  lVar2 = *in_FS_OFFSET;
  __s = (char *)(lVar2 + -0x800);
  GetUVError_abi_cxx11_(&local_48,errcode);
  uVar5 = 0;
  uVar3 = snprintf(__s,0x800,"%s",local_48._M_dataplus._M_p);
  pcVar7 = __s;
  if ((int)uVar3 < 0) {
LAB_0011af24:
    *pcVar7 = '\0';
  }
  else {
    uVar5 = uVar3;
    if (0x7ff < uVar3) {
      pcVar7 = (char *)(lVar2 + -1);
      uVar5 = 0x800;
      goto LAB_0011af24;
    }
  }
  uVar6 = (ulong)uVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (uVar5 < 0x800) {
    pcVar7 = __s + uVar6;
    uVar3 = 0;
    uVar5 = snprintf(pcVar7,0x800 - uVar6,"%s"," ( ");
    if ((int)uVar5 < 0) {
LAB_0011af8d:
      *pcVar7 = '\0';
      uVar5 = uVar3;
    }
    else {
      uVar3 = (uint)(0x800 - uVar6);
      if (uVar3 <= uVar5) {
        pcVar7 = (char *)(lVar2 + -1);
        goto LAB_0011af8d;
      }
    }
    uVar6 = uVar6 + uVar5;
  }
  if (0x7ff < uVar6) goto LAB_0011b088;
  pcVar7 = __s + uVar6;
  uVar3 = 0;
  uVar5 = snprintf(pcVar7,0x800 - uVar6,"%s"," ");
  if ((int)uVar5 < 0) {
LAB_0011afe2:
    *pcVar7 = '\0';
    uVar5 = uVar3;
  }
  else {
    uVar3 = (uint)(0x800 - uVar6);
    if (uVar3 <= uVar5) {
      pcVar7 = (char *)(lVar2 + -1);
      goto LAB_0011afe2;
    }
  }
  uVar6 = uVar6 + uVar5;
  if (0x7ff < uVar6) goto LAB_0011b088;
  pcVar7 = __s + uVar6;
  uVar3 = 0;
  uVar5 = snprintf(pcVar7,0x800 - uVar6,"%s"," ) : ");
  if ((int)uVar5 < 0) {
LAB_0011b037:
    *pcVar7 = '\0';
    uVar5 = uVar3;
  }
  else {
    uVar3 = (uint)(0x800 - uVar6);
    if (uVar3 <= uVar5) {
      pcVar7 = (char *)(lVar2 + -1);
      goto LAB_0011b037;
    }
  }
  uVar6 = uVar6 + uVar5;
  if (uVar6 < 0x800) {
    pcVar7 = __s + uVar6;
    uVar5 = snprintf(pcVar7,0x800 - uVar6,"%d",0x1a1);
    if (-1 < (int)uVar5) {
      if (uVar5 < (uint)(0x800 - uVar6)) goto LAB_0011b088;
      pcVar7 = (char *)(lVar2 + -1);
    }
    *pcVar7 = '\0';
  }
LAB_0011b088:
  pIVar4 = zsummer::log4z::ILog4zManager::GetInstance();
  (*pIVar4->_vptr_ILog4zManager[8])(pIVar4,0,3,__s);
  return;
}

Assistant:

void TCPClient::AfterClientClose(uv_handle_t* handle)
{
    TCPClient* theclass = (TCPClient*)handle->data;
    fprintf(stdout, "Close CB handle %p\n", handle);
    if (handle == (uv_handle_t*)&theclass->client_handle_->tcphandle && theclass->isreconnecting_) {
        //closed, start reconnect timer
        int iret = 0;
        iret = uv_timer_start(&theclass->reconnect_timer_, TCPClient::ReconnectTimer, theclass->repeat_time_, theclass->repeat_time_);
        if (iret) {
            uv_close((uv_handle_t*)&theclass->reconnect_timer_, TCPClient::AfterClientClose);
            LOGE(GetUVError(iret));
            return;
        }
    }
}